

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O2

FunctionSignature * __thiscall
Jinx::Impl::Parser::ParseFunctionSignature
          (FunctionSignature *__return_storage_ptr__,Parser *this,VisibilityType scope,
          SignatureParseMode mode)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  char *format;
  pointer __str;
  initializer_list<Jinx::Impl::SymbolType> symbols;
  int local_180;
  int local_17c;
  FunctionSignatureParts signatureParts;
  String paramName;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> n;
  FunctionSignaturePart part;
  
  bVar2 = Check(this,NewLine);
  if (bVar2) {
    Error<>(this,"Empty function signature");
    FunctionSignature::FunctionSignature(__return_storage_ptr__);
  }
  else {
    signatureParts.
    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    signatureParts.
    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    signatureParts.
    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar7 = 0;
    iVar6 = 0;
    local_17c = 0;
    local_180 = 0;
    bVar2 = false;
    bVar5 = false;
    do {
      bVar3 = Check(this,NewLine);
      if (bVar3) {
        if ((bVar2 || local_180 != 1) ||
           ((long)signatureParts.
                  super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)signatureParts.
                  super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0xc0)) {
          if (local_180 != iVar7) {
            FunctionSignature::FunctionSignature
                      (__return_storage_ptr__,scope,
                       &((this->m_library).
                         super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->m_name,&signatureParts);
            break;
          }
          format = "Function signature must have at least one non-optional name part";
        }
        else {
          format = "Function signature cannot match keyword";
        }
        Error<>(this,format);
        FunctionSignature::FunctionSignature(__return_storage_ptr__);
        break;
      }
      part.staticArena.m_ptr = (char *)&part;
      part.partType = Name;
      part.optional = false;
      part.valueType = Any;
      part.names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      part.names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      part.names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      part.names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
      ._M_impl.super__Tp_alloc_type.m_arena = (arena_type *)part.staticArena.m_ptr;
      bVar3 = Accept(this,CurlyOpen);
      if (bVar3) {
        if (bVar5 == false) {
          if ((local_180 == 0) || (local_17c < iVar6)) {
            part.partType = Parameter;
            bVar5 = CheckValueType(this);
            if (bVar5) {
              part.valueType = ParseValueType(this);
            }
            bVar5 = CheckName(this);
            if (!bVar5) {
              if (mode != FunctionDefinition) goto LAB_0011be49;
              Error<>(this,"No variable name found in function signature");
              goto LAB_0011bd05;
            }
            n._M_dataplus._M_p._0_4_ = 0x13;
            symbols._M_len = 1;
            symbols._M_array = (iterator)&n;
            ParseMultiName_abi_cxx11_(&paramName,this,symbols);
            bVar5 = Library::PropertyNameExists
                              ((this->m_library).
                               super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,&paramName);
            if (bVar5) {
              n._M_dataplus = paramName._M_dataplus;
              Error<char_const*>(this,
                                 "Function parameter name \'%s\' already exists as a property name",
                                 (char **)&n);
              FunctionSignature::FunctionSignature(__return_storage_ptr__);
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
              ::push_back(&part.names,&paramName);
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
            ~basic_string(&paramName);
            if (!bVar5) {
LAB_0011be49:
              iVar6 = 0;
              Expect(this,CurlyClose,(char *)0x0);
              local_17c = 0;
              goto LAB_0011be67;
            }
          }
          else {
            Error<>(this,"Arguments can\'t be separated soley by optional parameters");
LAB_0011bd05:
            FunctionSignature::FunctionSignature(__return_storage_ptr__);
          }
          bVar4 = false;
          bVar3 = false;
        }
        else {
          Error<>(this,"Functions cannot have multiple variables without a name separating them");
          FunctionSignature::FunctionSignature(__return_storage_ptr__);
          bVar3 = true;
LAB_0011bd60:
          bVar4 = false;
        }
      }
      else {
        part.optional = Accept(this,ParenOpen);
        bVar4 = CheckFunctionNamePart(this);
        if (!bVar4) {
          Error<>(this,"Invalid name in function signature");
LAB_0011bd2b:
          FunctionSignature::FunctionSignature(__return_storage_ptr__);
          bVar3 = bVar5;
          goto LAB_0011bd60;
        }
        bVar4 = IsKeyword(((this->m_currentSymbol)._M_current)->type);
        part.partType = Name;
        ParseFunctionNamePart_abi_cxx11_(&paramName,this);
        std::
        vector<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,Jinx::StaticAllocator<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,128ul,16ul>>
        ::
        emplace_back<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>>
                  ((vector<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,Jinx::StaticAllocator<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,128ul,16ul>>
                    *)&part.names,&paramName);
        local_180 = local_180 + 1;
        iVar6 = iVar6 + 1;
        bVar2 = (bool)(bVar2 | !bVar4);
        while( true ) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
          ~basic_string(&paramName);
          bVar4 = Accept(this,ForwardSlash);
          if (!bVar4) break;
          bVar4 = CheckFunctionNamePart(this);
          if (!bVar4) {
            Error<>(this,"Invalid name in function signature");
            goto LAB_0011bd2b;
          }
          ParseFunctionNamePart_abi_cxx11_(&paramName,this);
          pbVar1 = part.names.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (__str = part.names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                       ._M_impl.super__Vector_impl_data._M_start; __str != pbVar1; __str = __str + 1
              ) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
            basic_string(&n,__str);
            bVar4 = std::operator==(&n,&paramName);
            if (bVar4) {
              Error<>(this,"Duplicate alternative name in function signature");
              FunctionSignature::FunctionSignature(__return_storage_ptr__);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
              ~basic_string(&n);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
              ~basic_string(&paramName);
              bVar3 = bVar5;
              goto LAB_0011bd60;
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
            ~basic_string(&n);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
          ::push_back(&part.names,&paramName);
        }
        if (part.optional == true) {
          bVar4 = Expect(this,ParenClose,(char *)0x0);
          iVar7 = iVar7 + 1;
          local_17c = local_17c + 1;
          if (!bVar4) {
            Error<>(this,"Expected closing parentheses for optional function name part");
            goto LAB_0011bd2b;
          }
        }
LAB_0011be67:
        std::
        vector<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
        ::push_back(&signatureParts,&part);
        bVar4 = true;
      }
      FunctionSignaturePart::~FunctionSignaturePart(&part);
      bVar5 = bVar3;
    } while (bVar4);
    std::
    vector<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>::
    ~vector(&signatureParts);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t FunctionSignature Parser::ParseFunctionSignature(VisibilityType scope, SignatureParseMode mode)
	{
		if (Check(SymbolType::NewLine))
		{
			Error("Empty function signature");
			return FunctionSignature();
		}
		bool parsedParameter = false;
		bool parsedNonKeywordName = false;
		int parsedNameCount = 0;
		int optionalNameCount = 0;
		int parsedNameCountSection = 0;
		int optionalNameCountSection = 0;
		FunctionSignatureParts signatureParts;
		while (!Check(SymbolType::NewLine))
		{
			FunctionSignaturePart part;
			if (Accept(SymbolType::CurlyOpen))
			{
				if (parsedParameter)
				{
					Error("Functions cannot have multiple variables without a name separating them");
					return FunctionSignature();
				}
				if (parsedNameCount && parsedNameCountSection <= optionalNameCountSection)
				{
					Error("Arguments can't be separated soley by optional parameters");
					return FunctionSignature();
				}
				part.partType = FunctionSignaturePartType::Parameter;
				if (CheckValueType())
				{
					part.valueType = ParseValueType();
				}
				if (CheckName())
				{
					String paramName = ParseMultiName({ SymbolType::CurlyClose });
					if (m_library->PropertyNameExists(paramName))
					{
						Error("Function parameter name '%s' already exists as a property name", paramName.c_str());
						return FunctionSignature();
					}
					part.names.push_back(paramName);
				}
				else if (mode == SignatureParseMode::FunctionDefinition)
				{
					Error("No variable name found in function signature");
					return FunctionSignature();
				}
				Expect(SymbolType::CurlyClose);
				parsedParameter = true;
				parsedNameCountSection = 0;
				optionalNameCountSection = 0;
			}
			else
			{
				part.optional = Accept(SymbolType::ParenOpen);
				if (!CheckFunctionNamePart())
				{
					Error("Invalid name in function signature");
					return FunctionSignature();
				}
				parsedNameCount++;
				parsedNameCountSection++;
				if (IsKeyword(m_currentSymbol->type) == false)
					parsedNonKeywordName = true;
				part.partType = FunctionSignaturePartType::Name;
				part.names.push_back(ParseFunctionNamePart());
				while (Accept(SymbolType::ForwardSlash))
				{
					if (!CheckFunctionNamePart())
					{
						Error("Invalid name in function signature");
						return FunctionSignature();
					}
					auto name = ParseFunctionNamePart();
					for (auto n : part.names)
					{
						if (n == name)
						{
							Error("Duplicate alternative name in function signature");
							return FunctionSignature();
						}
					}
					part.names.push_back(name);
				}
				if (part.optional)
				{
					optionalNameCount++;
					optionalNameCountSection++;
					if (!Expect(SymbolType::ParenClose))
					{
						Error("Expected closing parentheses for optional function name part");
						return FunctionSignature();
					}
				}
				parsedParameter = false;
			}
			signatureParts.push_back(part);
		}

		// Check for function signature validity with matching keywords
		if (!parsedNonKeywordName)
		{
			if (parsedNameCount == 1 && signatureParts.size() == 1)
			{
				Error("Function signature cannot match keyword");
				return FunctionSignature();
			}
		}

		// Check to make sure the function has at least one non-optional keyword part
		if (parsedNameCount == optionalNameCount)
		{
			Error("Function signature must have at least one non-optional name part");
			return FunctionSignature();
		}

		// Create and return the function signature
		return FunctionSignature(scope, m_library->GetName(), signatureParts);
	}